

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

void __thiscall leveldb::BlockHandle::EncodeTo(BlockHandle *this,string *dst)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->offset_ == 0xffffffffffffffff) {
    __assert_fail("offset_ != ~static_cast<uint64_t>(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/format.cc"
                  ,0x11,"void leveldb::BlockHandle::EncodeTo(std::string *) const");
  }
  if (this->size_ != 0xffffffffffffffff) {
    PutVarint64(dst,this->offset_);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      PutVarint64(dst,this->size_);
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("size_ != ~static_cast<uint64_t>(0)",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/format.cc"
                ,0x12,"void leveldb::BlockHandle::EncodeTo(std::string *) const");
}

Assistant:

void BlockHandle::EncodeTo(std::string* dst) const {
  // Sanity check that all fields have been set
  assert(offset_ != ~static_cast<uint64_t>(0));
  assert(size_ != ~static_cast<uint64_t>(0));
  PutVarint64(dst, offset_);
  PutVarint64(dst, size_);
}